

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationData::addHighScriptRange
          (CollationData *this,uint8_t *table,int32_t index,int32_t highLimit)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  
  lVar2 = (long)index;
  uVar4 = (uint)this->scriptStarts[lVar2 + 1];
  uVar3 = highLimit + 0xff00;
  if ((uVar4 & 0xff) <= (highLimit & 0xffU)) {
    uVar3 = highLimit;
  }
  uVar1 = (uint)this->scriptStarts[lVar2];
  uVar3 = ((uVar1 & 0xff00) - (uVar4 & 0xff00)) + (uVar3 & 0xff00);
  table[lVar2] = (uint8_t)(uVar3 >> 8);
  return uVar1 & 0xff | uVar3;
}

Assistant:

int32_t
CollationData::addHighScriptRange(uint8_t table[], int32_t index, int32_t highLimit) const {
    int32_t limit = scriptStarts[index + 1];
    if((limit & 0xff) > (highLimit & 0xff)) {
        highLimit -= 0x100;
    }
    int32_t start = scriptStarts[index];
    highLimit = ((highLimit & 0xff00) - ((limit & 0xff00) - (start & 0xff00))) | (start & 0xff);
    table[index] = (uint8_t)(highLimit >> 8);
    return highLimit;
}